

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

Abc_Obj_t * Abc_NodeBddToMuxes(Abc_Obj_t *pNodeOld,Abc_Ntk_t *pNtkNew)

{
  DdManager *dd_00;
  void *pvVar1;
  int iVar2;
  st__table *table;
  Abc_Obj_t *pAVar3;
  DdNode *key;
  int local_44;
  int i;
  st__table *tBdd2Node;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pFaninOld;
  DdNode *bFunc;
  DdManager *dd;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Obj_t *pNodeOld_local;
  
  dd_00 = (DdManager *)pNodeOld->pNtk->pManFunc;
  pvVar1 = (pNodeOld->field_5).pData;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  for (local_44 = 0; iVar2 = Abc_ObjFaninNum(pNodeOld), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar3 = Abc_ObjFanin(pNodeOld,local_44);
    key = Cudd_bddIthVar(dd_00,local_44);
    st__insert(table,(char *)key,(char *)(pAVar3->field_6).pTemp);
  }
  tBdd2Node = (st__table *)
              Abc_NodeBddToMuxes_rec
                        (dd_00,(DdNode *)((ulong)pvVar1 & 0xfffffffffffffffe),pNtkNew,table);
  st__free_table(table);
  if (((ulong)pvVar1 & 1) != 0) {
    tBdd2Node = (st__table *)Abc_NtkCreateNodeInv(pNtkNew,(Abc_Obj_t *)tBdd2Node);
  }
  return (Abc_Obj_t *)tBdd2Node;
}

Assistant:

Abc_Obj_t * Abc_NodeBddToMuxes( Abc_Obj_t * pNodeOld, Abc_Ntk_t * pNtkNew )
{
    DdManager * dd = (DdManager *)pNodeOld->pNtk->pManFunc;
    DdNode * bFunc = (DdNode *)pNodeOld->pData;
    Abc_Obj_t * pFaninOld, * pNodeNew;
    st__table * tBdd2Node;
    int i;
    // create the table mapping BDD nodes into the ABC nodes
    tBdd2Node = st__init_table( st__ptrcmp, st__ptrhash );
    // add the constant and the elementary vars
    Abc_ObjForEachFanin( pNodeOld, pFaninOld, i )
        st__insert( tBdd2Node, (char *)Cudd_bddIthVar(dd, i), (char *)pFaninOld->pCopy );
    // create the new nodes recursively
    pNodeNew = Abc_NodeBddToMuxes_rec( dd, Cudd_Regular(bFunc), pNtkNew, tBdd2Node );
    st__free_table( tBdd2Node );
    if ( Cudd_IsComplement(bFunc) )
        pNodeNew = Abc_NtkCreateNodeInv( pNtkNew, pNodeNew );
    return pNodeNew;
}